

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  MdParser *this;
  undefined8 uVar3;
  string local_328;
  string local_308;
  undefined1 local_2e8 [8];
  string driver_string;
  ofstream output_file;
  NcursesDisplayDriver *local_c8;
  DisplayDriver *driver;
  string local_b8;
  MdParser *local_88;
  Parser *parser;
  MdlOptions op;
  char **argv_local;
  int argc_local;
  
  op._output_file.field_2._8_8_ = argv;
  setlocale(6,"");
  MdlOptions::MdlOptions((MdlOptions *)&parser,argc,(char **)op._output_file.field_2._8_8_);
  this = (MdParser *)operator_new(0x238);
  MdlOptions::input_file_abi_cxx11_(&local_b8,(MdlOptions *)&parser);
  MdParser::MdParser(this,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  local_c8 = (NcursesDisplayDriver *)0x0;
  local_88 = this;
  std::ofstream::ofstream((void *)((long)&driver_string.field_2 + 8));
  MdlOptions::display_driver_abi_cxx11_((string *)local_2e8,(MdlOptions *)&parser);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2e8,"plain");
  if (bVar1) {
    local_c8 = (NcursesDisplayDriver *)operator_new(0x10);
    PlainTextDisplayDriver::PlainTextDisplayDriver((PlainTextDisplayDriver *)local_c8);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2e8,"ncurses");
    if (bVar1) {
      local_c8 = (NcursesDisplayDriver *)operator_new(0x40);
      NcursesDisplayDriver::NcursesDisplayDriver(local_c8);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2e8,"latex");
      if (bVar1) {
        local_c8 = (NcursesDisplayDriver *)operator_new(0x10);
        LaTeXDisplayDriver::LaTeXDisplayDriver((LaTeXDisplayDriver *)local_c8,true);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2e8,"html");
        if (bVar1) {
          local_c8 = (NcursesDisplayDriver *)operator_new(0x10);
          HtmlDisplayDriver::HtmlDisplayDriver((HtmlDisplayDriver *)local_c8,true);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_2e8,"troff");
          if (bVar1) {
            local_c8 = (NcursesDisplayDriver *)operator_new(0x10);
            TroffDisplayDriver::TroffDisplayDriver((TroffDisplayDriver *)local_c8,true);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_2e8,"ansi");
            if (bVar1) {
              local_c8 = (NcursesDisplayDriver *)operator_new(0x10);
              AnsiDisplayDriver::AnsiDisplayDriver((AnsiDisplayDriver *)local_c8);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_2e8,"md");
              if (bVar1) {
                local_c8 = (NcursesDisplayDriver *)operator_new(0x10);
                MdDisplayDriver::MdDisplayDriver((MdDisplayDriver *)local_c8);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_2e8,"rst");
                if (bVar1) {
                  local_c8 = (NcursesDisplayDriver *)operator_new(0x10);
                  RstDisplayDriver::RstDisplayDriver((RstDisplayDriver *)local_c8);
                }
              }
            }
          }
        }
      }
    }
  }
  if (local_c8 == (NcursesDisplayDriver *)0x0) {
    __assert_fail("driver",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dopsi[P]mdl/mdl/main.cpp"
                  ,0x2c,"int main(int, char **)");
  }
  if (local_88 == (MdParser *)0x0) {
    __assert_fail("parser",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dopsi[P]mdl/mdl/main.cpp"
                  ,0x2d,"int main(int, char **)");
  }
  MdlOptions::output_file_abi_cxx11_(&local_308,(MdlOptions *)&parser);
  bVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_308);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    uVar3 = (**(code **)(*(long *)local_88 + 0x10))();
    (**(code **)(*(long *)local_c8 + 0x10))(local_c8,uVar3);
  }
  else {
    MdlOptions::output_file_abi_cxx11_(&local_328,(MdlOptions *)&parser);
    std::ofstream::open((undefined1 *)((long)&driver_string.field_2 + 8),&local_328,0x10);
    std::__cxx11::string::~string((string *)&local_328);
    uVar3 = (**(code **)(*(long *)local_88 + 0x10))();
    (**(code **)(*(long *)local_c8 + 0x18))
              (local_c8,uVar3,(undefined1 *)((long)&driver_string.field_2 + 8));
    std::ofstream::close();
  }
  if (local_c8 != (NcursesDisplayDriver *)0x0) {
    (**(code **)(*(long *)local_c8 + 8))();
  }
  if (local_88 != (MdParser *)0x0) {
    (**(code **)(*(long *)local_88 + 8))();
  }
  std::__cxx11::string::~string((string *)local_2e8);
  std::ofstream::~ofstream((void *)((long)&driver_string.field_2 + 8));
  MdlOptions::~MdlOptions((MdlOptions *)&parser);
  return 0;
}

Assistant:

int main(int argc, char ** argv) {
	setlocale(LC_ALL, "");

	MdlOptions op(argc, argv);
	Parser *parser(new MdParser(op.input_file()));
	DisplayDriver *driver(nullptr);
	ofstream output_file;

	string driver_string(op.display_driver());
	if (driver_string == "plain") {
		driver = new PlainTextDisplayDriver();
	} else if (driver_string == "ncurses") {
		driver = new NcursesDisplayDriver();
	} else if (driver_string == "latex") {
		driver = new LaTeXDisplayDriver(true);
	} else if (driver_string == "html") {
		driver = new HtmlDisplayDriver(true);
	} else if (driver_string == "troff") {
		driver = new TroffDisplayDriver(true);
	} else if (driver_string == "ansi") {
		driver = new AnsiDisplayDriver();
	} else if (driver_string == "md") {
		driver = new MdDisplayDriver();
	} else if (driver_string == "rst") {
		driver = new RstDisplayDriver();
	}

	assert(driver);
	assert(parser);
	
	/*
	 * This code section is not used since there is only one parser at the moment.
	 *
	if (vm.count("input-parser")) {
		// Select parser
	} else {
		// Default: MD
	}*/

	if (!op.output_file().empty()) {
		output_file.open(op.output_file());
		driver->display(parser->get_document(), output_file);
		output_file.close();
	} else {
		driver->display(parser->get_document());
	}

	delete driver;
	delete parser;

	return 0;
}